

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

ActionResultHolder<BasicTestExpr<1>_> *
testing::internal::ActionResultHolder<BasicTestExpr<1>>::
PerformDefaultAction<BasicTestExpr<1>(TestExprBuilder<2,BasicTestExpr<1>>)>
          (FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *func_mocker
          ,ArgumentTuple *args,string *call_description)

{
  undefined4 uVar1;
  ActionResultHolder<BasicTestExpr<1>_> *pAVar2;
  
  pAVar2 = (ActionResultHolder<BasicTestExpr<1>_> *)operator_new(0x10);
  uVar1 = FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
          PerformDefaultAction(func_mocker,args,call_description);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_0025f090;
  *(undefined4 *)&pAVar2->value_ = uVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      const typename Function<F>::ArgumentTuple& args,
      const string& call_description) {
    return new ActionResultHolder(
        func_mocker->PerformDefaultAction(args, call_description));
  }